

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  bool bVar1;
  BinOpr BVar2;
  undefined1 local_40 [4];
  BinOpr nextop;
  expdesc v2;
  BinOpr local_20;
  UnOpr uop;
  BinOpr op;
  uint limit_local;
  expdesc *v_local;
  LexState *ls_local;
  
  enterlevel(ls);
  v2.f = getunopr((ls->t).token);
  if (v2.f == OPR_NOUNOPR) {
    simpleexp(ls,v);
  }
  else {
    luaX_next(ls);
    subexpr(ls,v,8);
    luaK_prefix(ls->fs,v2.f,v);
  }
  local_20 = getbinopr((ls->t).token);
  while( true ) {
    bVar1 = false;
    if (local_20 != OPR_NOBINOPR) {
      bVar1 = limit < priority[local_20].left;
    }
    if (!bVar1) break;
    luaX_next(ls);
    luaK_infix(ls->fs,local_20,v);
    BVar2 = subexpr(ls,(expdesc *)local_40,(uint)priority[local_20].right);
    luaK_posfix(ls->fs,local_20,v,(expdesc *)local_40);
    local_20 = BVar2;
  }
  ls->L->nCcalls = ls->L->nCcalls - 1;
  return local_20;
}

Assistant:

static BinOpr subexpr(LexState*ls,expdesc*v,unsigned int limit){
BinOpr op;
UnOpr uop;
enterlevel(ls);
uop=getunopr(ls->t.token);
if(uop!=OPR_NOUNOPR){
luaX_next(ls);
subexpr(ls,v,8);
luaK_prefix(ls->fs,uop,v);
}
else simpleexp(ls,v);
op=getbinopr(ls->t.token);
while(op!=OPR_NOBINOPR&&priority[op].left>limit){
expdesc v2;
BinOpr nextop;
luaX_next(ls);
luaK_infix(ls->fs,op,v);
nextop=subexpr(ls,&v2,priority[op].right);
luaK_posfix(ls->fs,op,v,&v2);
op=nextop;
}
leavelevel(ls);
return op;
}